

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

void __thiscall
LongsEqualFailure::LongsEqualFailure
          (LongsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,long expected,
          long actual,SimpleString *text)

{
  SimpleString *this_00;
  SimpleString *rhs;
  undefined1 local_90 [16];
  SimpleString aDecimal;
  SimpleString expectedReported;
  SimpleString eDecimal;
  SimpleString actualReported;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_002f29c8;
  TestFailure::createUserText((TestFailure *)&aDecimal,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,&aDecimal);
  SimpleString::~SimpleString(&aDecimal);
  ::StringFrom((long)&aDecimal);
  ::StringFrom((long)&eDecimal);
  SimpleString::padStringsToSameLength(&aDecimal,&eDecimal,' ');
  SimpleString::SimpleString((SimpleString *)local_90," ");
  SimpleString::operator+(&expectedReported,&aDecimal);
  BracketsFormattedHexStringFrom((long)&stack0xffffffffffffff90);
  SimpleString::operator+(&actualReported,&expectedReported);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffff90);
  SimpleString::~SimpleString(&expectedReported);
  SimpleString::~SimpleString((SimpleString *)local_90);
  SimpleString::SimpleString((SimpleString *)&stack0xffffffffffffff90," ");
  SimpleString::operator+((SimpleString *)local_90,&eDecimal);
  BracketsFormattedHexStringFrom((long)&stack0xffffffffffffffc0);
  rhs = (SimpleString *)local_90;
  SimpleString::operator+(&expectedReported,rhs);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
  SimpleString::~SimpleString((SimpleString *)local_90);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffff90);
  TestFailure::createButWasString((TestFailure *)local_90,rhs,&expectedReported);
  SimpleString::operator+=(this_00,(SimpleString *)local_90);
  SimpleString::~SimpleString((SimpleString *)local_90);
  SimpleString::~SimpleString(&expectedReported);
  SimpleString::~SimpleString(&actualReported);
  SimpleString::~SimpleString(&eDecimal);
  SimpleString::~SimpleString(&aDecimal);
  return;
}

Assistant:

LongsEqualFailure::LongsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, long expected, long actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');

    SimpleString actualReported = aDecimal + " " + BracketsFormattedHexStringFrom(actual);
    SimpleString expectedReported = eDecimal + " " + BracketsFormattedHexStringFrom(expected);
    message_ += createButWasString(expectedReported, actualReported);
}